

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_sphere_wires(rf_vec3 center_pos,float radius,int rings,int slices,rf_color color)

{
  rf_render_batch *prVar1;
  rf_vertex_buffer *prVar2;
  rf_mat *prVar3;
  rf_mat left;
  undefined1 auVar4 [56];
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float __x;
  float __x_00;
  float __x_01;
  rf_mat mat_scale;
  uchar local_128;
  float local_118;
  float fStack_114;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  prVar1 = (rf__ctx->field_0).current_batch;
  lVar6 = prVar1->current_buffer;
  prVar2 = prVar1->vertex_buffers;
  if (prVar2[lVar6].elements_count * 4 <= slices * (rings + 2) * 6 + prVar2[lVar6].v_counter) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_118 = center_pos.x;
  fStack_114 = center_pos.y;
  rf_gfx_translatef(local_118,fStack_114,center_pos.z);
  prVar3 = (rf__ctx->field_0).current_matrix;
  auVar4 = ZEXT4456(CONCAT440(radius,ZEXT2440(CONCAT816((ulong)(uint)radius << 0x20,
                                                        ZEXT416((uint)radius)))));
  left.m11 = 0.0;
  left.m15 = 1.0;
  left.m0 = (float)auVar4._0_4_;
  left.m4 = (float)auVar4._4_4_;
  left.m8 = (float)auVar4._8_4_;
  left.m12 = (float)auVar4._12_4_;
  left.m1 = (float)auVar4._16_4_;
  left.m5 = (float)auVar4._20_4_;
  left.m9 = (float)auVar4._24_4_;
  left.m13 = (float)auVar4._28_4_;
  left.m2 = (float)auVar4._32_4_;
  left.m6 = (float)auVar4._36_4_;
  left.m10 = (float)auVar4._40_4_;
  left.m14 = (float)auVar4._44_4_;
  left.m3 = (float)auVar4._48_4_;
  left.m7 = (float)auVar4._52_4_;
  rf_mat_mul(left,*prVar3);
  prVar3->m3 = (float)(undefined4)local_40;
  prVar3->m7 = (float)local_40._4_4_;
  prVar3->m11 = (float)(undefined4)uStack_38;
  prVar3->m15 = (float)uStack_38._4_4_;
  prVar3->m2 = (float)(undefined4)local_50;
  prVar3->m6 = (float)local_50._4_4_;
  prVar3->m10 = (float)(undefined4)uStack_48;
  prVar3->m14 = (float)uStack_48._4_4_;
  prVar3->m1 = (float)(undefined4)local_60;
  prVar3->m5 = (float)local_60._4_4_;
  prVar3->m9 = (float)(undefined4)uStack_58;
  prVar3->m13 = (float)uStack_58._4_4_;
  prVar3->m0 = (float)(undefined4)local_70;
  prVar3->m4 = (float)local_70._4_4_;
  prVar3->m8 = (float)(undefined4)uStack_68;
  prVar3->m12 = (float)uStack_68._4_4_;
  rf_gfx_begin(RF_LINES);
  local_128 = color.g;
  rf_gfx_color4ub(color.r,local_128,color.b,color.a);
  if (-2 < rings) {
    uVar8 = (ulong)slices;
    lVar6 = 0;
    do {
      if (0 < slices) {
        lVar5 = (long)(int)(0xb4 / (long)(rings + 1));
        __x = (float)(lVar6 * lVar5 + 0x10e) * 0.017453292;
        __x_01 = (float)(lVar5 * (lVar6 + 1) + 0x10e) * 0.017453292;
        uVar9 = 0x168;
        uVar7 = uVar8;
        do {
          fVar10 = cosf(__x);
          __x_00 = (float)(long)((uVar9 - 0x168) / uVar8) * 0.017453292;
          fVar11 = sinf(__x_00);
          fVar12 = sinf(__x);
          fVar13 = cosf(__x);
          fVar14 = cosf(__x_00);
          rf_gfx_vertex3f(fVar11 * fVar10,fVar12,fVar13 * fVar14);
          fVar10 = cosf(__x_01);
          fVar11 = (float)(long)(uVar9 / uVar8) * 0.017453292;
          fVar12 = sinf(fVar11);
          fVar13 = sinf(__x_01);
          fVar14 = cosf(__x_01);
          fVar15 = cosf(fVar11);
          rf_gfx_vertex3f(fVar12 * fVar10,fVar13,fVar14 * fVar15);
          fVar10 = cosf(__x_01);
          fVar12 = sinf(fVar11);
          fVar13 = sinf(__x_01);
          fVar14 = cosf(__x_01);
          fVar11 = cosf(fVar11);
          rf_gfx_vertex3f(fVar12 * fVar10,fVar13,fVar14 * fVar11);
          fVar10 = cosf(__x_01);
          fVar11 = sinf(__x_00);
          fVar12 = sinf(__x_01);
          fVar13 = cosf(__x_01);
          fVar14 = cosf(__x_00);
          rf_gfx_vertex3f(fVar11 * fVar10,fVar12,fVar13 * fVar14);
          fVar10 = cosf(__x_01);
          fVar11 = sinf(__x_00);
          fVar12 = sinf(__x_01);
          fVar13 = cosf(__x_01);
          fVar14 = cosf(__x_00);
          rf_gfx_vertex3f(fVar11 * fVar10,fVar12,fVar13 * fVar14);
          fVar10 = cosf(__x);
          fVar11 = sinf(__x_00);
          fVar12 = sinf(__x);
          fVar13 = cosf(__x);
          fVar14 = cosf(__x_00);
          rf_gfx_vertex3f(fVar11 * fVar10,fVar12,fVar13 * fVar14);
          uVar9 = uVar9 + 0x168;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != rings + 2);
  }
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_sphere_wires(rf_vec3 center_pos, float radius, int rings, int slices, rf_color color)
{
    int num_vertex = (rings + 2)*slices*6;
    if (rf_gfx_check_buffer_limit(num_vertex)) rf_gfx_draw();

    rf_gfx_push_matrix();
    // NOTE: Transformation is applied in inverse order (scale -> translate)
    rf_gfx_translatef(center_pos.x, center_pos.y, center_pos.z);
    rf_gfx_scalef(radius, radius, radius);

    rf_gfx_begin(RF_LINES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    for (rf_int i = 0; i < (rings + 2); i++)
    {
        for (rf_int j = 0; j < slices; j++)
        {
            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*i))*sinf(RF_DEG2RAD*(j * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*i)),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*i))*cosf(RF_DEG2RAD*(j * 360/slices)));
            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*sinf(RF_DEG2RAD*((j+1) * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1))),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*cosf(RF_DEG2RAD*((j+1) * 360/slices)));

            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*sinf(RF_DEG2RAD*((j+1) * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1))),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*cosf(RF_DEG2RAD*((j+1) * 360/slices)));
            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*sinf(RF_DEG2RAD*(j * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1))),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*cosf(RF_DEG2RAD*(j * 360/slices)));

            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*sinf(RF_DEG2RAD*(j * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1))),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*(i+1)))*cosf(RF_DEG2RAD*(j * 360/slices)));

            rf_gfx_vertex3f(cosf(RF_DEG2RAD*(270+(180/(rings + 1))*i))*sinf(RF_DEG2RAD*(j * 360/slices)),
                           sinf(RF_DEG2RAD*(270+(180/(rings + 1))*i)),
                           cosf(RF_DEG2RAD*(270+(180/(rings + 1))*i))*cosf(RF_DEG2RAD*(j * 360/slices)));
        }
    }

    rf_gfx_end();
    rf_gfx_pop_matrix();
}